

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::operator=
          (CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *this,
          CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *other)

{
  perfetto::protos::gen::ChromeHistogramSample::operator=
            ((this->ptr_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>.
             _M_head_impl,
             (other->ptr_)._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>.
             _M_head_impl);
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }